

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O0

void duckdb::BinaryTrimFunction<false,true>(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  Vector *in_RDX;
  anon_class_8_1_6971b95b in_RSI;
  DataChunk *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffd0;
  Vector *left;
  
  pvVar1 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](in_stack_ffffffffffffffd0,(size_type)pvVar1);
  left = in_RDX;
  DataChunk::size(in_RDI);
  BinaryExecutor::
  Execute<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_>
            (left,left,in_RDX,(idx_t)pvVar1,in_RSI);
  return;
}

Assistant:

static void BinaryTrimFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t input, string_t ignored) {
		    auto data = input.GetData();
		    auto size = input.GetSize();

		    unordered_set<utf8proc_int32_t> ignored_codepoints;
		    GetIgnoredCodepoints(ignored, ignored_codepoints);

		    utf8proc_int32_t codepoint;
		    auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		    // Find the first character that is not left trimmed
		    idx_t begin = 0;
		    if (LTRIM) {
			    while (begin < size) {
				    auto bytes =
				        utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    break;
				    }
				    begin += UnsafeNumericCast<idx_t>(bytes);
			    }
		    }

		    // Find the last character that is not right trimmed
		    idx_t end;
		    if (RTRIM) {
			    end = begin;
			    for (auto next = begin; next < size;) {
				    auto bytes =
				        utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				    D_ASSERT(bytes > 0);
				    next += UnsafeNumericCast<idx_t>(bytes);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    end = next;
				    }
			    }
		    } else {
			    end = size;
		    }

		    // Copy the trimmed string
		    auto target = StringVector::EmptyString(result, end - begin);
		    auto output = target.GetDataWriteable();
		    memcpy(output, data + begin, end - begin);

		    target.Finalize();
		    return target;
	    });
}